

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp5::groebnerRow39_00100_f
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double factor;
  Index in_stack_ffffffffffffff98;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *in_stack_ffffffffffffffa0;
  DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x9ce501);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce51f);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce543);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce56b);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce589);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pSVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar8,auVar12);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce5d9);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce5f7);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *pSVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar9,auVar13);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce647);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce665);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *pSVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar10,auVar14);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce6b5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>,_1>::operator()
                     (this,in_stack_ffffffffffffff98,0x9ce6d3);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pSVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::groebnerRow39_00100_f( Eigen::Matrix<double,44,80> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,63) / groebnerMatrix(39,75);
  groebnerMatrix(targetRow,63) = 0.0;
  groebnerMatrix(targetRow,64) -= factor * groebnerMatrix(39,76);
  groebnerMatrix(targetRow,67) -= factor * groebnerMatrix(39,77);
  groebnerMatrix(targetRow,71) -= factor * groebnerMatrix(39,78);
  groebnerMatrix(targetRow,76) -= factor * groebnerMatrix(39,79);
}